

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

void __thiscall cmFileLockPool::PushFileScope(cmFileLockPool *this)

{
  _List_node_base *local_10;
  
  local_10 = (_List_node_base *)operator_new(0x18);
  local_10->_M_prev = local_10;
  local_10->_M_next = local_10;
  local_10[1]._M_next = (_List_node_base *)0x0;
  std::__cxx11::list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::
  push_back(&this->FileScopes,(value_type *)&local_10);
  return;
}

Assistant:

void cmFileLockPool::PushFileScope()
{
  this->FileScopes.push_back(new ScopePool());
}